

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsp.hh
# Opt level: O3

PathResult
wsp(Position *start,function<bool_(Position)> *reached_end,State *state,
   function<int_(Position)> *cell_cost)

{
  ulong *puVar1;
  char cVar2;
  int iVar3;
  Direction DVar4;
  _Bit_type *p_Var5;
  pointer piVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  Position PVar12;
  int iVar13;
  long lVar14;
  Direction DVar15;
  ulong uVar16;
  Direction DVar17;
  PathResult PVar18;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  C;
  allocator_type local_ba;
  allocator_type local_b9;
  vector<int,_std::allocator<int>_> local_b8;
  Position *local_a0;
  priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
  local_98;
  Direction local_70;
  _Any_data *local_68;
  ulong local_60;
  _Any_data *local_58;
  Direction local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)start;
  local_a0 = start;
  local_68 = (_Any_data *)cell_cost;
  if ((reached_end->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00106fa3;
  bVar7 = (*reached_end->_M_invoker)((_Any_data *)reached_end,(Position *)&local_98);
  if (bVar7) {
    uVar11 = 1;
    DVar17 = Direction::STAY;
    goto LAB_00106f7c;
  }
  local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SeenMatrix::reset();
  iVar8 = (state->maze).r;
  std::vector<int,_std::allocator<int>_>::vector(&local_b8,(long)(state->maze).c,&MAXINT,&local_b9);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,(long)iVar8,&local_b8,&local_ba);
  local_58 = (_Any_data *)reached_end;
  if ((Position)
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (Position)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar8 = local_a0->i;
  iVar3 = local_a0->j;
  uVar9 = (ulong)iVar3;
  iVar13 = iVar3 + 0x3f;
  if (-1 < (long)uVar9) {
    iVar13 = iVar3;
  }
  puVar1 = SeenMatrix::S.
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar8].
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._M_p +
           (long)(iVar13 >> 6) +
           (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)iVar3 & 0x3f);
  iVar8 = PathMagic::index_from_pos.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar8].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [uVar9];
  DVar17 = *(Direction *)
            (PathMagic::valid_dirs.
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar8);
  local_70 = (Direction)
             PathMagic::valid_dirs.
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar8].
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  if (DVar17 != local_70) {
    do {
      cVar2 = *(char *)DVar17;
      uVar9 = (long)Direction::LIST[cVar2].i + (long)local_a0->i;
      lVar14 = (long)Direction::LIST[cVar2].j + (long)local_a0->j;
      PVar12 = (Position)(uVar9 & 0xffffffff | lVar14 << 0x20);
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)PVar12;
      if (*(long *)(local_68 + 1) == 0) goto LAB_00106f99;
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (**(code **)(local_68->_M_pod_data + 0x18))(local_68,(Position *)&local_b8);
      local_48.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar9].super__Vector_base<int,_std::allocator<int>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar14] =
           (int)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(Direction::LIST + cVar2);
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)PVar12;
      std::
      priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
      ::push(&local_98,(value_type *)&local_b8);
      DVar17 = (Direction)((long)DVar17 + 1);
    } while (DVar17 != local_70);
  }
  if (local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_00106f5e:
    uVar11 = 0;
  }
  else {
    local_60 = 0x800000000000003f;
    do {
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)
                  local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl
                  .super__Vector_impl_data._M_start;
      if (*(long *)(local_58 + 1) == 0) goto LAB_00106f9e;
      bVar7 = (**(code **)(local_58->_M_pod_data + 0x18))(local_58,(Position *)&local_b8);
      if (bVar7) break;
      iVar8 = *(int *)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      iVar3 = *(int *)((long)local_98.c.
                             super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl
                             .super__Vector_impl_data._M_start + 4);
      DVar4 = *(Direction *)
               ((long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                      _M_impl.super__Vector_impl_data._M_start + 8);
      if (0x14 < (long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                       _M_impl.super__Vector_impl_data._M_start) {
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             *(int *)((long)local_98.c.
                            super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
                            super__Vector_impl_data._M_finish + -4);
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = *(pointer *)
                    ((long)local_98.c.
                           super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
                           super__Vector_impl_data._M_finish + -0x14);
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = *(pointer *)
                     ((long)local_98.c.
                            super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
                            super__Vector_impl_data._M_finish + -0xc);
        *(int *)((long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -0x14) = iVar8;
        *(int *)((long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -0x10) = iVar3;
        *(int *)((long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -0xc) = DVar4.i;
        *(int *)((long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -8) = DVar4.j;
        *(int *)((long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -4) =
             *(int *)((long)local_98.c.
                            super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
                            super__Vector_impl_data._M_start + 0x10);
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<CostPathStep*,std::vector<CostPathStep,std::allocator<CostPathStep>>>,long,CostPathStep,__gnu_cxx::__ops::_Iter_comp_iter<wsp(Position_const&,std::function<bool(Position)>,State_const&,std::function<int(Position)>)::__0>>
                  (local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                   _M_impl.super__Vector_impl_data._M_start,0,
                   ((long)((long)local_98.c.
                                 super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -0x14) -
                    (long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333);
      }
      lVar14 = (long)iVar8;
      local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((long)local_98.c.
                           super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
                           super__Vector_impl_data._M_finish + -0x14);
      iVar8 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar8 = iVar3;
      }
      p_Var5 = SeenMatrix::S.
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar14].
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p;
      uVar16 = (ulong)iVar3;
      uVar10 = (ulong)((uVar16 & local_60) < 0x8000000000000001);
      uVar9 = p_Var5[(long)(iVar8 >> 6) + uVar10 + 0xffffffffffffffff];
      if ((uVar9 >> (uVar16 & 0x3f) & 1) == 0) {
        p_Var5[(long)(iVar8 >> 6) + uVar10 + 0xffffffffffffffff] =
             uVar9 | 1L << ((byte)iVar3 & 0x3f);
        local_a0 = (Position *)(lVar14 * 3);
        iVar8 = PathMagic::index_from_pos.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar14].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar16];
        DVar15 = *(Direction *)
                  (PathMagic::valid_dirs.
                   super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar8);
        local_70 = (Direction)
                   PathMagic::valid_dirs.
                   super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar8].
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
        local_50 = DVar4;
        if (DVar15 != local_70) {
          do {
            uVar9 = Direction::LIST[*(char *)DVar15].i + lVar14;
            DVar17 = (Direction)((long)Direction::LIST[*(char *)DVar15].j + uVar16);
            PVar12 = (Position)(uVar9 & 0xffffffff | (long)DVar17 << 0x20);
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)PVar12;
            if (*(long *)(local_68 + 1) == 0) {
              std::__throw_bad_function_call();
              goto LAB_00106f99;
            }
            iVar8 = (**(code **)(local_68->_M_pod_data + 0x18))(local_68,(Position *)&local_b8);
            iVar8 = iVar8 + (&((local_48.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start)[(long)local_a0][uVar16] + 1;
            piVar6 = local_48.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            if (iVar8 < piVar6[(long)DVar17]) {
              piVar6[(long)DVar17] = iVar8;
              local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = (pointer)local_50;
              local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start = (pointer)PVar12;
              local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage._0_4_ = iVar8;
              std::
              priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
              ::push(&local_98,(value_type *)&local_b8);
            }
            DVar15 = (Direction)((long)DVar15 + 1);
          } while (DVar15 != local_70);
        }
      }
    } while (local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00106f5e;
    DVar17 = *(Direction *)
              ((long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                     _M_impl.super__Vector_impl_data._M_start + 8);
    uVar11 = 1;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  if ((Position)
      local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
      super__Vector_impl_data._M_start != (Position)0x0) {
    operator_delete(local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_00106f7c:
  PVar18.found = (bool)(char)uVar11;
  PVar18._9_3_ = (int3)((ulong)uVar11 >> 8);
  PVar18.dist = (int)((ulong)uVar11 >> 0x20);
  PVar18.dir = DVar17;
  return PVar18;
LAB_00106f99:
  std::__throw_bad_function_call();
LAB_00106f9e:
  std::__throw_bad_function_call();
LAB_00106fa3:
  uVar11 = std::__throw_bad_function_call();
  if ((Position)
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (Position)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((Position)
      local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
      super__Vector_impl_data._M_start != (Position)0x0) {
    operator_delete(local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar11);
}

Assistant:

PathResult wsp(const Position& start,
                          function<bool(Position)> reached_end,
                          const State& state,
                          function<int(Position)> cell_cost) {

    if (reached_end(start)) return PathResult(Direction::STAY, 0);

    auto comp = [](const CostPathStep& a, const CostPathStep& b) {
        return a.cost > b.cost;
    };

    priority_queue<CostPathStep, vector<CostPathStep>, decltype(comp)> Q(comp);
    SeenMatrix::reset();
    vector<vector<bool>>& S = SeenMatrix::S;
    vector<vector<int>> C(state.maze.rows(), vector<int>(state.maze.cols(), MAXINT));

    S[start.i][start.j] = true;

    for (char d : PathMagic::dirs(start)) {
        const Direction& dir = Direction::LIST[(int)d];
        Position s = start.move_destination(dir);

        C[s.i][s.j] = cell_cost(s);
        Q.push(CostPathStep(s, dir, C[s.i][s.j]));
    }

    while (not Q.empty() and not reached_end(Q.top().pos)) {
        CostPathStep a = Q.top(); Q.pop();
        if (not S[a.pos.i][a.pos.j]) {
            S[a.pos.i][a.pos.j] = true;
            for (char d : PathMagic::dirs(a.pos)) {
                const Direction& dir = Direction::LIST[(int)d];
                Position s = a.pos.move_destination(dir);
                int c = cell_cost(s) + 1;
                if (C[a.pos.i][a.pos.j] + c < C[s.i][s.j]) {
                    C[s.i][s.j] = C[a.pos.i][a.pos.j] + c;
                    Q.push(CostPathStep(s, a.initial, C[s.i][s.j]));
    }   }   }   }

    return Q.empty() ? PathResult(false) : PathResult(Q.top().initial, 0);
}